

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

LexToken lex_scan(LexState *ls,TValue *tv)

{
  LexChar LVar1;
  LexToken LVar2;
  byte *pbVar3;
  int iVar4;
  GCstr *pGVar5;
  SBuf *pSVar6;
  bool bVar7;
  uint local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  uint local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  uint local_200;
  uint local_1fc;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e0;
  LexChar c;
  int sep_1;
  int sep;
  GCstr *s;
  TValue *tv_local;
  LexState *ls_local;
  char *w;
  char *w_1;
  char *local_28;
  char *local_10;
  
  (ls->sb).w = (ls->sb).b;
  do {
    if ((""[(long)ls->c + 1] & 0x80) != 0) {
      if ((""[(long)ls->c + 1] & 8) == 0) {
        do {
          LVar1 = ls->c;
          pSVar6 = &ls->sb;
          if ((int)(ls->sb).e == (int)pSVar6->w) {
            local_10 = lj_buf_more2(pSVar6,1);
          }
          else {
            local_10 = pSVar6->w;
          }
          *local_10 = (char)LVar1;
          pSVar6->w = local_10 + 1;
          if (ls->p < ls->pe) {
            pbVar3 = (byte *)ls->p;
            ls->p = (char *)(pbVar3 + 1);
            local_1e0 = (uint)*pbVar3;
          }
          else {
            local_1e0 = lex_more(ls);
          }
          ls->c = local_1e0;
        } while ((""[(long)ls->c + 1] & 0x80) != 0);
        pGVar5 = lj_parse_keepstr(ls,(ls->sb).b,(ulong)(uint)((int)(ls->sb).w - (int)(ls->sb).b));
        tv->u64 = (ulong)pGVar5 | 0xfffd800000000000;
        if (pGVar5->reserved == '\0') {
          ls_local._4_4_ = 0x11f;
        }
        else {
          ls_local._4_4_ = pGVar5->reserved + 0x100;
        }
      }
      else {
        lex_number(ls,tv);
        ls_local._4_4_ = 0x11e;
      }
      return ls_local._4_4_;
    }
    switch(ls->c) {
    default:
      LVar2 = ls->c;
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_234 = (uint)*pbVar3;
      }
      else {
        local_234 = lex_more(ls);
      }
      ls->c = local_234;
      return LVar2;
    case 9:
    case 0xb:
    case 0xc:
    case 0x20:
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_1ec = (uint)*pbVar3;
      }
      else {
        local_1ec = lex_more(ls);
      }
      ls->c = local_1ec;
      break;
    case 10:
    case 0xd:
      lex_newline(ls);
      break;
    case 0x22:
    case 0x27:
      lex_string(ls,tv);
      return 0x120;
    case 0x2d:
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_1f0 = (uint)*pbVar3;
      }
      else {
        local_1f0 = lex_more(ls);
      }
      ls->c = local_1f0;
      if (ls->c != 0x2d) {
        return 0x2d;
      }
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_1f4 = (uint)*pbVar3;
      }
      else {
        local_1f4 = lex_more(ls);
      }
      ls->c = local_1f4;
      if (ls->c == 0x5b) {
        iVar4 = lex_skipeq(ls);
        (ls->sb).w = (ls->sb).b;
        if (iVar4 < 0) goto LAB_0018b267;
        lex_longstring(ls,(TValue *)0x0,iVar4);
        (ls->sb).w = (ls->sb).b;
      }
      else {
LAB_0018b267:
        while( true ) {
          bVar7 = false;
          if ((ls->c != 10) && (bVar7 = false, ls->c != 0xd)) {
            bVar7 = ls->c != -1;
          }
          if (!bVar7) break;
          if (ls->p < ls->pe) {
            pbVar3 = (byte *)ls->p;
            ls->p = (char *)(pbVar3 + 1);
            local_1fc = (uint)*pbVar3;
          }
          else {
            local_1fc = lex_more(ls);
          }
          ls->c = local_1fc;
        }
      }
      break;
    case 0x2e:
      LVar1 = ls->c;
      pSVar6 = &ls->sb;
      if ((int)(ls->sb).e == (int)pSVar6->w) {
        local_28 = lj_buf_more2(pSVar6,1);
      }
      else {
        local_28 = pSVar6->w;
      }
      *local_28 = (char)LVar1;
      pSVar6->w = local_28 + 1;
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_228 = (uint)*pbVar3;
      }
      else {
        local_228 = lex_more(ls);
      }
      ls->c = local_228;
      if (local_228 == 0x2e) {
        if (ls->p < ls->pe) {
          pbVar3 = (byte *)ls->p;
          ls->p = (char *)(pbVar3 + 1);
          local_22c = (uint)*pbVar3;
        }
        else {
          local_22c = lex_more(ls);
        }
        ls->c = local_22c;
        if (ls->c == 0x2e) {
          if (ls->p < ls->pe) {
            pbVar3 = (byte *)ls->p;
            ls->p = (char *)(pbVar3 + 1);
            local_230 = (uint)*pbVar3;
          }
          else {
            local_230 = lex_more(ls);
          }
          ls->c = local_230;
          return 0x118;
        }
        return 0x117;
      }
      if ((""[(long)ls->c + 1] & 8) == 0) {
        return 0x2e;
      }
      lex_number(ls,tv);
      return 0x11e;
    case 0x3a:
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_220 = (uint)*pbVar3;
      }
      else {
        local_220 = lex_more(ls);
      }
      ls->c = local_220;
      if (ls->c != 0x3a) {
        return 0x3a;
      }
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_224 = (uint)*pbVar3;
      }
      else {
        local_224 = lex_more(ls);
      }
      ls->c = local_224;
      return 0x11d;
    case 0x3c:
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_208 = (uint)*pbVar3;
      }
      else {
        local_208 = lex_more(ls);
      }
      ls->c = local_208;
      if (ls->c != 0x3d) {
        return 0x3c;
      }
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_20c = (uint)*pbVar3;
      }
      else {
        local_20c = lex_more(ls);
      }
      ls->c = local_20c;
      return 0x11b;
    case 0x3d:
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_200 = (uint)*pbVar3;
      }
      else {
        local_200 = lex_more(ls);
      }
      ls->c = local_200;
      if (ls->c != 0x3d) {
        return 0x3d;
      }
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_204 = (uint)*pbVar3;
      }
      else {
        local_204 = lex_more(ls);
      }
      ls->c = local_204;
      return 0x119;
    case 0x3e:
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_210 = (uint)*pbVar3;
      }
      else {
        local_210 = lex_more(ls);
      }
      ls->c = local_210;
      if (ls->c != 0x3d) {
        return 0x3e;
      }
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_214 = (uint)*pbVar3;
      }
      else {
        local_214 = lex_more(ls);
      }
      ls->c = local_214;
      return 0x11a;
    case 0x5b:
      iVar4 = lex_skipeq(ls);
      if (-1 < iVar4) {
        lex_longstring(ls,tv,iVar4);
        return 0x120;
      }
      if (iVar4 == -1) {
        return 0x5b;
      }
      lj_lex_error(ls,0x120,LJ_ERR_XLDELIM);
    case 0x7e:
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_218 = (uint)*pbVar3;
      }
      else {
        local_218 = lex_more(ls);
      }
      ls->c = local_218;
      if (ls->c != 0x3d) {
        return 0x7e;
      }
      if (ls->p < ls->pe) {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        local_21c = (uint)*pbVar3;
      }
      else {
        local_21c = lex_more(ls);
      }
      ls->c = local_21c;
      return 0x11c;
    case -1:
      return 0x121;
    }
  } while( true );
}

Assistant:

static LexToken lex_scan(LexState *ls, TValue *tv)
{
  lj_buf_reset(&ls->sb);
  for (;;) {
    if (lj_char_isident(ls->c)) {
      GCstr *s;
      if (lj_char_isdigit(ls->c)) {  /* Numeric literal. */
	lex_number(ls, tv);
	return TK_number;
      }
      /* Identifier or reserved word. */
      do {
	lex_savenext(ls);
      } while (lj_char_isident(ls->c));
      s = lj_parse_keepstr(ls, ls->sb.b, sbuflen(&ls->sb));
      setstrV(ls->L, tv, s);
      if (s->reserved > 0)  /* Reserved word? */
	return TK_OFS + s->reserved;
      return TK_name;
    }
    switch (ls->c) {
    case '\n':
    case '\r':
      lex_newline(ls);
      continue;
    case ' ':
    case '\t':
    case '\v':
    case '\f':
      lex_next(ls);
      continue;
    case '-':
      lex_next(ls);
      if (ls->c != '-') return '-';
      lex_next(ls);
      if (ls->c == '[') {  /* Long comment "--[=*[...]=*]". */
	int sep = lex_skipeq(ls);
	lj_buf_reset(&ls->sb);  /* `lex_skipeq' may dirty the buffer */
	if (sep >= 0) {
	  lex_longstring(ls, NULL, sep);
	  lj_buf_reset(&ls->sb);
	  continue;
	}
      }
      /* Short comment "--.*\n". */
      while (!lex_iseol(ls) && ls->c != LEX_EOF)
	lex_next(ls);
      continue;
    case '[': {
      int sep = lex_skipeq(ls);
      if (sep >= 0) {
	lex_longstring(ls, tv, sep);
	return TK_string;
      } else if (sep == -1) {
	return '[';
      } else {
	lj_lex_error(ls, TK_string, LJ_ERR_XLDELIM);
	continue;
      }
      }
    case '=':
      lex_next(ls);
      if (ls->c != '=') return '='; else { lex_next(ls); return TK_eq; }
    case '<':
      lex_next(ls);
      if (ls->c != '=') return '<'; else { lex_next(ls); return TK_le; }
    case '>':
      lex_next(ls);
      if (ls->c != '=') return '>'; else { lex_next(ls); return TK_ge; }
    case '~':
      lex_next(ls);
      if (ls->c != '=') return '~'; else { lex_next(ls); return TK_ne; }
    case ':':
      lex_next(ls);
      if (ls->c != ':') return ':'; else { lex_next(ls); return TK_label; }
    case '"':
    case '\'':
      lex_string(ls, tv);
      return TK_string;
    case '.':
      if (lex_savenext(ls) == '.') {
	lex_next(ls);
	if (ls->c == '.') {
	  lex_next(ls);
	  return TK_dots;   /* ... */
	}
	return TK_concat;   /* .. */
      } else if (!lj_char_isdigit(ls->c)) {
	return '.';
      } else {
	lex_number(ls, tv);
	return TK_number;
      }
    case LEX_EOF:
      return TK_eof;
    default: {
      LexChar c = ls->c;
      lex_next(ls);
      return c;  /* Single-char tokens (+ - / ...). */
    }
    }
  }
}